

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O0

int array_negation_range_test(int r_start,int r_end,_Bool is_bitset)

{
  _Bool _Var1;
  undefined1 uVar2;
  int iVar3;
  int in_ESI;
  int in_EDI;
  bool bVar4;
  int unaff_retaddr;
  int unaff_retaddr_00;
  array_container_t *in_stack_00000008;
  _Bool should_be_present;
  int x_2;
  int result_card;
  uint8_t result_typecode;
  int x_1;
  int x;
  container_t *BO;
  array_container_t *AI;
  int result_size_should_be;
  _Bool result_is_bitset;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbe;
  uint8_t in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar6;
  int local_28;
  int local_24;
  
  array_container_create();
  for (local_24 = 0; local_24 < 0x10000; local_24 = local_24 + 0x1d) {
    array_container_add((array_container_t *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        CONCAT11(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffbe));
  }
  for (local_28 = 0; local_28 < 0x10000; local_28 = local_28 + 1) {
  }
  _Var1 = array_container_negation_range
                    (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                     (container_t **)CONCAT44(in_EDI,in_ESI));
  uVar2 = 2;
  if (_Var1) {
    uVar2 = 1;
  }
  uVar6 = CONCAT13(uVar2,(int3)in_stack_ffffffffffffffd4);
  iVar3 = container_get_cardinality
                    ((container_t *)
                     CONCAT17(in_stack_ffffffffffffffbf,
                              CONCAT16(in_stack_ffffffffffffffbe,
                                       CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                                      )),'\0');
  _assert_int_equal(CONCAT44(uVar6,iVar3),
                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    CONCAT13(in_stack_ffffffffffffffbf,
                             CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
  _assert_int_equal(CONCAT44(uVar6,iVar3),
                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    CONCAT13(in_stack_ffffffffffffffbf,
                             CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
  for (uVar5 = 0; (int)uVar5 < 0x10000; uVar5 = uVar5 + 1) {
    if (((int)uVar5 < in_EDI) || (in_ESI <= (int)uVar5)) {
      bVar4 = (int)uVar5 % 0x1d == 0;
    }
    else {
      bVar4 = (int)uVar5 % 0x1d != 0;
    }
    in_stack_ffffffffffffffc8 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffc4 = (uint)bVar4;
    _Var1 = container_contains((container_t *)
                               CONCAT17(in_stack_ffffffffffffffbf,
                                        CONCAT16(in_stack_ffffffffffffffbe,
                                                 CONCAT24(in_stack_ffffffffffffffbc,
                                                          in_stack_ffffffffffffffb8))),0,'\0');
    if (in_stack_ffffffffffffffc4 != _Var1) {
      printf("oops on %d\n",(ulong)uVar5);
    }
    container_contains((container_t *)
                       CONCAT17(in_stack_ffffffffffffffbf,
                                CONCAT16(in_stack_ffffffffffffffbe,
                                         CONCAT24(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8))),0,'\0');
    _assert_int_equal(CONCAT44(uVar6,iVar3),CONCAT44(uVar5,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      CONCAT13(in_stack_ffffffffffffffbf,
                               CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
  }
  container_free((container_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbf);
  array_container_free((array_container_t *)0x108ab8);
  return 1;
}

Assistant:

static int array_negation_range_test(int r_start, int r_end, bool is_bitset) {
    bool result_is_bitset;
    int result_size_should_be = 0;

    array_container_t* AI = array_container_create();
    container_t* BO;  // bitset or array

    for (int x = 0; x < (1 << 16); x += 29) {
        array_container_add(AI, (uint16_t)x);
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x >= r_start && x < r_end)
            if (x % 29 != 0)
                result_size_should_be++;
            else {
            }
        else if (x % 29 == 0)
            result_size_should_be++;
    }

    result_is_bitset = array_container_negation_range(AI, r_start, r_end, &BO);
    uint8_t result_typecode =
        (result_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);

    int result_card = container_get_cardinality(BO, result_typecode);

    assert_int_equal(is_bitset, result_is_bitset);
    assert_int_equal(result_size_should_be, result_card);

    for (int x = 0; x < (1 << 16); x++) {
        bool should_be_present;
        if (x >= r_start && x < r_end)
            should_be_present = (x % 29 != 0);
        else
            should_be_present = (x % 29 == 0);

#ifndef UNVERBOSE_MIXED_CONTAINER
        if (should_be_present !=
            container_contains(BO, (uint16_t)x, result_typecode))
            printf("oops on %d\n", x);
#endif
        assert_int_equal(container_contains(BO, (uint16_t)x, result_typecode),
                         should_be_present);
    }
    container_free(BO, result_typecode);
    array_container_free(AI);
    return 1;
}